

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

int Dsd_TreeCountPrimeNodes(Dsd_Manager_t *pDsdMan)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (pDsdMan->nRoots < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = Dsd_TreeCountPrimeNodes_rec
                        ((Dsd_Node_t *)((ulong)pDsdMan->pRoots[lVar3] & 0xfffffffffffffffe));
      iVar2 = iVar2 + iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < pDsdMan->nRoots);
  }
  Dsd_TreeUnmark(pDsdMan);
  return iVar2;
}

Assistant:

int Dsd_TreeCountPrimeNodes( Dsd_Manager_t * pDsdMan )
{
    int Counter, i;
    Counter = 0;
    for ( i = 0; i < pDsdMan->nRoots; i++ )
        Counter += Dsd_TreeCountPrimeNodes_rec( Dsd_Regular( pDsdMan->pRoots[i] ) );
    Dsd_TreeUnmark( pDsdMan );
    return Counter;
}